

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile(TiledRgbaInputFile *this,IStream *is,int numThreads)

{
  undefined1 in_stack_ffffffffffffff0f;
  ContextInitializer *this_00;
  IStream *in_stack_ffffffffffffff28;
  ContextInitializer *in_stack_ffffffffffffff30;
  string local_b8 [12];
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  ContextInitializer *in_stack_ffffffffffffff60;
  char *name;
  TiledRgbaInputFile *this_01;
  
  IStream::fileName((IStream *)0x24d5e8);
  name = (char *)0x0;
  this_01 = (TiledRgbaInputFile *)0x0;
  this_00 = (ContextInitializer *)&stack0xffffffffffffff68;
  ContextInitializer::ContextInitializer(this_00);
  ContextInitializer::silentHeaderParse(this_00,(bool)in_stack_ffffffffffffff0f);
  ContextInitializer::strictHeaderValidation(this_00,(bool)in_stack_ffffffffffffff0f);
  ContextInitializer::setInputStream(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::string(local_b8);
  TiledRgbaInputFile(this_01,name,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff54);
  std::__cxx11::string::~string(local_b8);
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int numThreads)
    : TiledRgbaInputFile (
        is.fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (&is),
        std::string(),
        numThreads)
{
}